

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pc-identifiers.c
# Opt level: O2

EVENT_TYPE validate_pc_signature(char *str_code)

{
  int iVar1;
  uchar *__ptr;
  PcIdentifier *identifiers;
  long lVar2;
  ulong uVar3;
  IDENTIFICATION_STRATEGY strategy;
  IDENTIFICATION_STRATEGY IVar4;
  EVENT_TYPE EVar5;
  long lVar6;
  uint calc_identifiers_size;
  PcIdentifier user_identifiers [2];
  uint local_4c;
  char base64ids [17];
  
  calc_identifiers_size = 0;
  EVar5 = LICENSE_OK;
  __isoc99_sscanf(str_code,"%4s-%4s-%4s-%4s",base64ids,base64ids + 4,base64ids + 8,base64ids + 0xc);
  __ptr = unbase64(base64ids,0x10,(int *)&local_4c);
  if (local_4c < 0xd) {
    user_identifiers[0]._4_2_ = *(undefined2 *)(__ptr + 4);
    user_identifiers[0]._0_4_ = *(undefined4 *)__ptr;
    user_identifiers[1]._0_4_ = *(undefined4 *)(__ptr + 6);
    user_identifiers[1]._4_2_ = *(undefined2 *)(__ptr + 10);
  }
  else {
    EVar5 = ENVIRONMENT_VARIABLE_NOT_DEFINED;
  }
  free(__ptr);
  if (local_4c < 0xd) {
    IVar4 = STRATEGY_UNKNOWN;
    uVar3 = 0;
    identifiers = (PcIdentifier *)0x0;
    for (lVar2 = 0; EVar5 = IDENTIFIERS_MISMATCH, lVar2 != 2; lVar2 = lVar2 + 1) {
      strategy = (IDENTIFICATION_STRATEGY)(user_identifiers[lVar2][0] >> 5);
      if (strategy == STRATEGY_UNKNOWN) {
        EVar5 = LICENSE_MALFORMED;
        break;
      }
      if (IVar4 != strategy) {
        free(identifiers);
        generate_pc_id((PcIdentifier *)0x0,&calc_identifiers_size,strategy);
        identifiers = (PcIdentifier *)calloc(1,(ulong)calc_identifiers_size * 6);
        generate_pc_id(identifiers,&calc_identifiers_size,strategy);
        uVar3 = (ulong)calc_identifiers_size;
        IVar4 = strategy;
      }
      lVar6 = 0;
      while (uVar3 * 6 + 6 != lVar6 + 6) {
        iVar1 = bcmp(user_identifiers + lVar2,*identifiers + lVar6,6);
        lVar6 = lVar6 + 6;
        if (iVar1 == 0) {
          EVar5 = LICENSE_OK;
          goto LAB_00219142;
        }
      }
    }
LAB_00219142:
    free(identifiers);
  }
  return EVar5;
}

Assistant:

EVENT_TYPE validate_pc_signature(PcSignature str_code) {
	PcIdentifier user_identifiers[2];
	FUNCTION_RETURN result;
	IDENTIFICATION_STRATEGY previous_strategy_id, current_strategy_id;
	PcIdentifier* calculated_identifiers = NULL;
	unsigned int calc_identifiers_size = 0;
	int i = 0, j = 0;
	//bool found;
#ifdef _DEBUG
	printf("Comparing pc identifiers: \n");
#endif
	result = decode_pc_id(user_identifiers[0], user_identifiers[1], str_code);
	if (result != FUNC_RET_OK) {
		return result;
	}
	previous_strategy_id = STRATEGY_UNKNOWN;
	//found = false;
	for (i = 0; i < 2; i++) {
		current_strategy_id = strategy_from_pc_id(user_identifiers[i]);
		if (current_strategy_id == STRATEGY_UNKNOWN) {
			free(calculated_identifiers);
			return LICENSE_MALFORMED;
		}
		if (current_strategy_id != previous_strategy_id) {
			if (calculated_identifiers != NULL) {
				free(calculated_identifiers);
			}
			previous_strategy_id = current_strategy_id;
			generate_pc_id(NULL, &calc_identifiers_size, current_strategy_id);
			calculated_identifiers = (PcIdentifier *) malloc(
					sizeof(PcIdentifier) * calc_identifiers_size);
			memset(calculated_identifiers, 0, sizeof(PcIdentifier) * calc_identifiers_size);
			generate_pc_id(calculated_identifiers, &calc_identifiers_size,
					current_strategy_id);
		}
		//maybe skip the byte 0
		for (j = 0; j < calc_identifiers_size; j++) {
#ifdef _DEBUG
			printf("generated id: %02x%02x%02x%02x%02x%02x index %d, user_supplied id %02x%02x%02x%02x%02x%02x idx: %d\n",
					calculated_identifiers[j][0], calculated_identifiers[j][1], calculated_identifiers[j][2],
					calculated_identifiers[j][3], calculated_identifiers[j][4], calculated_identifiers[j][5], j,
					user_identifiers[i][0], user_identifiers[i][1], user_identifiers[i][2], user_identifiers[i][3], user_identifiers[i][4], user_identifiers[i][5], i);

#endif
			if (!memcmp(user_identifiers[i], calculated_identifiers[j],
					sizeof(PcIdentifier))) {
				free(calculated_identifiers);
				return LICENSE_OK;
			}
		}
	}
	free(calculated_identifiers);
	return IDENTIFIERS_MISMATCH;
}